

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hh
# Opt level: O1

process_id_t __thiscall tchecker::system::processes_t::process_id(processes_t *this,string *name)

{
  invalid_argument *this_00;
  flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_48;
  
  boost::container::dtl::
  flat_tree<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_boost::container::dtl::select1st<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::find(&local_48,(key_type *)&this->_procs_index);
  if (local_48.m_data.m_seq.m_holder.m_start !=
      (this->_procs_index)._key_map.m_flat_tree.m_data.m_seq.m_holder.m_start +
      (this->_procs_index)._key_map.m_flat_tree.m_data.m_seq.m_holder.m_size) {
    return (local_48.m_data.m_seq.m_holder.m_start)->second;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"key is not indexed");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline tchecker::process_id_t process_id(std::string const & name) const
  {
    try {
      return _procs_index.value(name);
    }
    catch (...) {
      throw std::invalid_argument("Unknown process " + name);
    }
  }